

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O1

void __thiscall tli_window_manager::TableBox::add(TableBox *this,Box *box,int row,int col)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  
  plVar1 = *(long **)(*(long *)&(this->table_).
                                super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[row].
                                super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                                ._M_impl.super__Vector_impl_data + (long)col * 0x10);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x20))();
  }
  iVar2 = (*box->_vptr_Box[2])(box);
  *(ulong *)(*(long *)&(this->table_).
                       super__Vector_base<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[row].
                       super__Vector_base<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                       ._M_impl.super__Vector_impl_data + (long)col * 0x10) =
       CONCAT44(extraout_var,iVar2);
  return;
}

Assistant:

void TableBox::add(Box *box, int row, int col) {
    delete table_[row][col].first;
    table_[row][col].first = box->clone();
}